

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswmcpl.c
# Opt level: O0

void ssw_strcat(char *dest,char *src,size_t destbuflen)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  size_t n;
  size_t ns;
  size_t nd;
  size_t in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  
  sVar1 = ssw_strlen(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  sVar2 = ssw_strlen(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  uVar3 = sVar1 + sVar2;
  if (sVar2 != 0) {
    if (((uVar3 < sVar1) || (uVar3 < sVar2)) || (in_RDX < uVar3)) {
      ssw_error((char *)0x1052d4);
    }
    memcpy((void *)(in_RDI + sVar1),in_RSI,sVar2 + 1);
  }
  return;
}

Assistant:

void ssw_strcat( char * dest, const char * src, size_t destbuflen )
{
  size_t nd = ssw_strlen( dest, destbuflen );
  size_t ns = ssw_strlen( src, destbuflen );
  size_t n = nd + ns;
  if (!ns)
    return;
  if ( n < nd || n < ns || n > destbuflen )
    ssw_error("ssw_strcat: resulting string size out of range");
  memcpy( dest + nd, src, ns+1 );
}